

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session_impl.cpp
# Opt level: O2

session_params * __thiscall
libtorrent::aux::session_impl::session_state
          (session_params *__return_storage_ptr__,session_impl *this,save_state_flags_t flags)

{
  dht_tracker *this_00;
  ip_filter *piVar1;
  pointer psVar2;
  mapped_type *this_01;
  pointer ppVar3;
  pointer psVar4;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  state;
  undefined1 local_80 [16];
  pointer local_70;
  pointer ppStack_68;
  _Base_ptr local_60;
  pointer ppStack_58;
  pointer local_50;
  pointer ppStack_48;
  
  session_params::session_params(__return_storage_ptr__);
  if ((flags.m_val & 1) != 0) {
    non_default_settings((settings_pack *)local_80,&this->m_settings);
    settings_pack::operator=
              (&__return_storage_ptr__->settings,
               (vector<libtorrent::torrent_handle,_std::allocator<libtorrent::torrent_handle>_> *)
               local_80);
    settings_pack::~settings_pack((settings_pack *)local_80);
  }
  if ((flags.m_val & 2) != 0) {
    get_dht_settings((dht_settings *)local_80,this);
    *(pointer *)&(__return_storage_ptr__->dht_settings).item_lifetime = local_50;
    *(pointer *)&(__return_storage_ptr__->dht_settings).sample_infohashes_interval = ppStack_48;
    *(_Base_ptr *)&(__return_storage_ptr__->dht_settings).privacy_lookups = local_60;
    *(pointer *)&(__return_storage_ptr__->dht_settings).block_ratelimit = ppStack_58;
    *(pointer *)&(__return_storage_ptr__->dht_settings).max_dht_items = local_70;
    *(pointer *)&(__return_storage_ptr__->dht_settings).max_torrent_search_reply = ppStack_68;
    (__return_storage_ptr__->dht_settings).max_peers_reply = local_80._0_4_;
    (__return_storage_ptr__->dht_settings).search_branching = local_80._4_4_;
    (__return_storage_ptr__->dht_settings).max_fail_count = local_80._8_4_;
    (__return_storage_ptr__->dht_settings).max_torrents = local_80._12_4_;
  }
  this_00 = (this->m_dht).
            super___shared_ptr<libtorrent::dht::dht_tracker,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (((byte)((flags.m_val & 4) >> 2) & this_00 != (dht_tracker *)0x0) == 1) {
    libtorrent::dht::dht_tracker::state((dht_state *)local_80,this_00);
    libtorrent::dht::dht_state::operator=(&__return_storage_ptr__->dht_state,(dht_state *)local_80);
    libtorrent::dht::dht_state::~dht_state((dht_state *)local_80);
  }
  if ((flags.m_val >> 0xb & 1) != 0) {
    psVar2 = (this->m_ses_extensions)._M_elems[0].
             super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (psVar4 = (this->m_ses_extensions)._M_elems[0].
                  super__Vector_base<std::shared_ptr<libtorrent::plugin>,_std::allocator<std::shared_ptr<libtorrent::plugin>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; psVar4 != psVar2; psVar4 = psVar4 + 1)
    {
      (*((psVar4->super___shared_ptr<libtorrent::plugin,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)->
        _vptr_plugin[0xd])
                ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_80);
      for (ppVar3 = ppStack_68; ppVar3 != (pointer)(local_80 + 8);
          ppVar3 = (pointer)::std::_Rb_tree_increment((_Rb_tree_node_base *)ppVar3)) {
        this_01 = ::std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator[](&__return_storage_ptr__->ext_state,
                               (key_type *)((long)&(ppVar3->second).field_2 + 8));
        ::std::__cxx11::string::operator=
                  ((string *)this_01,(string *)ppVar3[1].second.field_2._M_local_buf);
      }
      ::std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::~_Rb_tree((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   *)local_80);
    }
  }
  if (((flags.m_val >> 0xc & 1) != 0) &&
     (piVar1 = (this->m_ip_filter).
               super___shared_ptr<libtorrent::ip_filter,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
     piVar1 != (ip_filter *)0x0)) {
    ip_filter::operator=(&__return_storage_ptr__->ip_filter,piVar1);
  }
  return __return_storage_ptr__;
}

Assistant:

session_params session_impl::session_state(save_state_flags_t const flags) const
	{
		TORRENT_ASSERT(is_single_thread());

		session_params ret;
		if (flags & session::save_settings)
			ret.settings = non_default_settings(m_settings);

#ifndef TORRENT_DISABLE_DHT
#if TORRENT_ABI_VERSION <= 2
	if (flags & session_handle::save_dht_settings)
	{
		ret.dht_settings = get_dht_settings();
	}
#endif

		if (m_dht && (flags & session::save_dht_state))
			ret.dht_state = m_dht->state();
#endif

#ifndef TORRENT_DISABLE_EXTENSIONS
		if (flags & session::save_extension_state)
		{
			for (auto const& ext : m_ses_extensions[plugins_all_idx])
			{
				auto state = ext->save_state();
				for (auto& v : state)
					ret.ext_state[std::move(v.first)] = std::move(v.second);
			}
		}
#endif

		if ((flags & session::save_ip_filter) && m_ip_filter)
		{
			ret.ip_filter = *m_ip_filter;
		}
		return ret;
	}